

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

void Fossilize::DestroyDevice(VkDevice device,VkAllocationCallbacks *pAllocator)

{
  void *key_00;
  Device *this;
  VkLayerDispatchTable *pVVar1;
  Device *layer;
  void *key;
  lock_guard<std::mutex> holder;
  VkAllocationCallbacks *pAllocator_local;
  VkDevice device_local;
  
  holder._M_device = (mutex_type *)pAllocator;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&key,(mutex_type *)globalLock);
  key_00 = getDispatchKey(device);
  this = getLayerData<Fossilize::Device>
                   (key_00,(unordered_map<void_*,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>_>_>
                            *)deviceData);
  pVVar1 = Device::getTable(this);
  (*pVVar1->DestroyDevice)(device,(VkAllocationCallbacks *)holder._M_device);
  destroyLayerData<Fossilize::Device>
            (key_00,(unordered_map<void_*,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>_>_>
                     *)deviceData);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&key);
  return;
}

Assistant:

static VKAPI_ATTR void VKAPI_CALL DestroyDevice(VkDevice device, const VkAllocationCallbacks *pAllocator)
{
	lock_guard<mutex> holder{ globalLock };

	void *key = getDispatchKey(device);
	auto *layer = getLayerData(key, deviceData);

	layer->getTable()->DestroyDevice(device, pAllocator);
	destroyLayerData(key, deviceData);
}